

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int parse_codes(archive_read *a)

{
  bool bVar1;
  int iVar2;
  Bool BVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  archive *in_RDI;
  uint new_size;
  void *new_window;
  rar_br *br;
  rar *rar;
  huffman_code precode;
  uint maxorder;
  uchar ppmd_flags;
  uchar zerocount;
  uchar bitlengths [20];
  int r;
  int n;
  int val;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 in_stack_ffffffffffffff82;
  char in_stack_ffffffffffffff83;
  UInt32 in_stack_ffffffffffffff84;
  CPpmd7 *in_stack_ffffffffffffff88;
  CPpmd7 *p;
  archive_read *a_00;
  huffman_code *in_stack_ffffffffffffffa0;
  archive_read *in_stack_ffffffffffffffa8;
  void *local_48;
  uint local_40;
  byte local_38 [20];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  archive *local_10;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  p = (CPpmd7 *)a_00[8].formats;
  local_10 = in_RDI;
  free_codes((archive_read *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT13(in_stack_ffffffffffffff83,
                               CONCAT12(in_stack_ffffffffffffff82,
                                        CONCAT11(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80
                                                )))));
  *(uint *)&p->MaxContext = *(uint *)&p->MaxContext & 0xfffffff8;
  if (((0 < *(int *)&p->MaxContext) || (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 != 0)) ||
     (0 < *(int *)&p->MaxContext)) {
    uVar4 = (ulong)p->MinContext >> ((char)*(int *)&p->MaxContext - 1U & 0x3f);
    *(byte *)((long)&a_00->bidders[0xc].options + 3) = (byte)uVar4 & 1;
    if ((uVar4 & 1) == 0) {
      *(int *)&p->MaxContext = *(int *)&p->MaxContext + -1;
      if (((0 < *(int *)&p->MaxContext) || (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 != 0)) ||
         (0 < *(int *)&p->MaxContext)) {
        if (((ulong)p->MinContext >> ((char)*(int *)&p->MaxContext - 1U & 0x3f) & (ulong)1) == 0) {
          memset(&a_00->bidders[2].options,0,0x194);
        }
        *(int *)&p->MaxContext = *(int *)&p->MaxContext + -1;
        memset(local_38,0,0x14);
        local_14 = 0;
        while (local_14 < 0x14) {
          if (((*(int *)&p->MaxContext < 4) && (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)
              ) && (*(int *)&p->MaxContext < 4)) goto LAB_0014b2a3;
          iVar2 = local_14;
          local_14 = local_14 + 1;
          local_38[iVar2] =
               (byte)((ulong)p->MinContext >> ((char)*(undefined4 *)&p->MaxContext - 4U & 0x3f)) &
               0xf;
          *(int *)&p->MaxContext = *(int *)&p->MaxContext + -4;
          if (local_38[local_14 + -1] == 0xf) {
            if (((*(int *)&p->MaxContext < 4) &&
                (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)) &&
               (*(int *)&p->MaxContext < 4)) goto LAB_0014b2a3;
            uVar4 = (ulong)p->MinContext >> ((char)*(undefined4 *)&p->MaxContext - 4U & 0x3f);
            *(int *)&p->MaxContext = *(int *)&p->MaxContext + -4;
            if ((uVar4 & 0xf) != 0) {
              local_14 = local_14 + -1;
              for (local_18 = 0; bVar1 = local_18 < (int)(((byte)uVar4 & 0xf) + 2),
                  in_stack_ffffffffffffff83 = bVar1 && local_14 < 0x14, bVar1 && local_14 < 0x14;
                  local_18 = local_18 + 1) {
                lVar5 = (long)local_14;
                local_14 = local_14 + 1;
                local_38[lVar5] = 0;
              }
            }
          }
        }
        memset(&stack0xffffffffffffffa0,0,0x20);
        local_24 = create_code(a_00,(huffman_code *)p,(uchar *)in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff83);
        if (local_24 != 0) {
          free(in_stack_ffffffffffffffa0);
          free(local_48);
          return local_24;
        }
        local_14 = 0;
        local_24 = 0;
        while (local_14 < 0x194) {
          local_1c = read_next_symbol(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          if (local_1c < 0) {
            free(in_stack_ffffffffffffffa0);
            free(local_48);
            return -0x1e;
          }
          if (local_1c < 0x10) {
            *(byte *)((long)&a_00->bidders[2].options + (long)local_14) =
                 *(char *)((long)&a_00->bidders[2].options + (long)local_14) + (char)local_1c & 0xf;
            local_14 = local_14 + 1;
          }
          else if (local_1c < 0x12) {
            if (local_14 == 0) {
              free(in_stack_ffffffffffffffa0);
              free(local_48);
              archive_set_error(local_10,0x54,"Internal error extracting RAR file.");
              return -0x1e;
            }
            if (local_1c == 0x10) {
              if (((*(int *)&p->MaxContext < 3) &&
                  (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)) &&
                 (*(int *)&p->MaxContext < 3)) {
                free(in_stack_ffffffffffffffa0);
                free(local_48);
                goto LAB_0014b2a3;
              }
              local_20 = ((uint)((ulong)p->MinContext >>
                                ((char)*(undefined4 *)&p->MaxContext - 3U & 0x3f)) & 7) + 3;
              *(int *)&p->MaxContext = *(int *)&p->MaxContext + -3;
            }
            else {
              if (((*(int *)&p->MaxContext < 7) &&
                  (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)) &&
                 (*(int *)&p->MaxContext < 7)) {
                free(in_stack_ffffffffffffffa0);
                free(local_48);
                goto LAB_0014b2a3;
              }
              local_20 = ((uint)((ulong)p->MinContext >>
                                ((char)*(undefined4 *)&p->MaxContext - 7U & 0x3f)) & 0x7f) + 0xb;
              *(int *)&p->MaxContext = *(int *)&p->MaxContext + -7;
            }
            for (local_18 = 0; local_18 < local_20 && local_14 < 0x194; local_18 = local_18 + 1) {
              *(undefined1 *)((long)&a_00->bidders[2].options + (long)local_14) =
                   *(undefined1 *)((long)&a_00->bidders[2].options + (long)(local_14 + -1));
              local_14 = local_14 + 1;
            }
          }
          else {
            if (local_1c == 0x12) {
              if (((*(int *)&p->MaxContext < 3) &&
                  (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)) &&
                 (*(int *)&p->MaxContext < 3)) {
                free(in_stack_ffffffffffffffa0);
                free(local_48);
                goto LAB_0014b2a3;
              }
              local_20 = ((uint)((ulong)p->MinContext >>
                                ((char)*(undefined4 *)&p->MaxContext - 3U & 0x3f)) & 7) + 3;
              *(int *)&p->MaxContext = *(int *)&p->MaxContext + -3;
            }
            else {
              if (((*(int *)&p->MaxContext < 7) &&
                  (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)) &&
                 (*(int *)&p->MaxContext < 7)) {
                free(in_stack_ffffffffffffffa0);
                free(local_48);
                goto LAB_0014b2a3;
              }
              local_20 = ((uint)((ulong)p->MinContext >>
                                ((char)*(undefined4 *)&p->MaxContext - 7U & 0x3f)) & 0x7f) + 0xb;
              *(int *)&p->MaxContext = *(int *)&p->MaxContext + -7;
            }
            for (local_18 = 0; local_18 < local_20 && local_14 < 0x194; local_18 = local_18 + 1) {
              *(undefined1 *)((long)&a_00->bidders[2].options + (long)local_14) = 0;
              local_14 = local_14 + 1;
            }
          }
        }
        free(in_stack_ffffffffffffffa0);
        free(local_48);
        local_24 = create_code(a_00,(huffman_code *)p,(uchar *)in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff83);
        if (local_24 != 0) {
          return local_24;
        }
        local_24 = create_code(a_00,(huffman_code *)p,(uchar *)in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff83);
        if (local_24 != 0) {
          return local_24;
        }
        local_24 = create_code(a_00,(huffman_code *)p,(uchar *)in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffff84,in_stack_ffffffffffffff83);
        if (local_24 != 0) {
          return local_24;
        }
        iVar2 = create_code(a_00,(huffman_code *)p,(uchar *)in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff84,in_stack_ffffffffffffff83);
        if (iVar2 != 0) {
          return iVar2;
        }
        local_24 = 0;
        goto LAB_0014b195;
      }
    }
    else {
      *(int *)&p->MaxContext = *(int *)&p->MaxContext + -1;
      if (((6 < *(int *)&p->MaxContext) || (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 != 0)) ||
         (6 < *(int *)&p->MaxContext)) {
        uVar4 = (ulong)p->MinContext >> ((char)*(int *)&p->MaxContext - 7U & 0x3f);
        *(int *)&p->MaxContext = *(int *)&p->MaxContext + -7;
        if ((uVar4 & 0x20) != 0) {
          if (((*(int *)&p->MaxContext < 8) && (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)
              ) && (*(int *)&p->MaxContext < 8)) goto LAB_0014b2a3;
          *(uint *)&(a_00->client).closer =
               (((uint)((ulong)p->MinContext >> ((char)*(int *)&p->MaxContext - 8U & 0x3f)) & 0xff)
               + 1) * 0x100000;
          *(int *)&p->MaxContext = *(int *)&p->MaxContext + -8;
        }
        if ((uVar4 & 0x40) == 0) {
          *(undefined4 *)((long)&a_00->bidders[0xc].options + 4) = 2;
        }
        else {
          if (((*(int *)&p->MaxContext < 8) && (iVar2 = rar_br_fillup(a_00,(rar_br *)p), iVar2 == 0)
              ) && (*(int *)&p->MaxContext < 8)) goto LAB_0014b2a3;
          uVar7 = (uint)((ulong)p->MinContext >> ((char)*(int *)&p->MaxContext - 8U & 0x3f)) & 0xff;
          *(uint *)((long)&a_00->bidders[0xd].bid + 4) = uVar7;
          *(uint *)((long)&a_00->bidders[0xc].options + 4) = uVar7;
          *(int *)&p->MaxContext = *(int *)&p->MaxContext + -8;
        }
        if ((uVar4 & 0x20) == 0) {
          if (*(char *)((long)&a_00->bidders[0xc].options + 1) == '\0') {
            archive_set_error(local_10,0x54,"Invalid PPMd sequence");
            return -0x1e;
          }
          BVar3 = PpmdRAR_RangeDec_Init
                            ((CPpmd7z_RangeDec *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (BVar3 == 0) {
            archive_set_error(local_10,0x54,"Unable to initialize PPMd range decoder");
            return -0x1e;
          }
        }
        else {
          uVar7 = ((byte)uVar4 & 0x7f) & 0x1f;
          local_40 = uVar7 + 1;
          if (0x10 < local_40) {
            local_40 = (uVar7 - 0xf) * 3 + 0x10;
          }
          if (local_40 == 1) {
            archive_set_error(local_10,0x54,"Truncated RAR file data");
            return -0x1e;
          }
          Ppmd7_Free((CPpmd7 *)
                     CONCAT44(in_stack_ffffffffffffff84,
                              CONCAT13(in_stack_ffffffffffffff83,
                                       CONCAT12(in_stack_ffffffffffffff82,
                                                CONCAT11(in_stack_ffffffffffffff81,
                                                         in_stack_ffffffffffffff80)))),
                     (ISzAlloc *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          a_00[8].bidders[0xd].init = (_func_int_archive_read_filter_ptr *)local_10;
          a_00[8].bidders[0xd].options = ppmd_read;
          PpmdRAR_RangeDec_CreateVTable((CPpmd7z_RangeDec *)&a_00[8].bidders[0xc].init);
          a_00[8].bidders[0xd].bid =
               (_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr *)
               &a_00[8].bidders[0xd].init;
          Ppmd7_Construct(p);
          BVar3 = Ppmd7_Alloc(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                              (ISzAlloc *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (BVar3 == 0) {
            archive_set_error(local_10,0xc,"Out of memory");
            return -0x1e;
          }
          BVar3 = PpmdRAR_RangeDec_Init
                            ((CPpmd7z_RangeDec *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          if (BVar3 == 0) {
            archive_set_error(local_10,0x54,"Unable to initialize PPMd range decoder");
            return -0x1e;
          }
          Ppmd7_Init((CPpmd7 *)
                     CONCAT44(in_stack_ffffffffffffff84,
                              CONCAT13(in_stack_ffffffffffffff83,
                                       CONCAT12(in_stack_ffffffffffffff82,
                                                CONCAT11(in_stack_ffffffffffffff81,
                                                         in_stack_ffffffffffffff80)))),
                     in_stack_ffffffffffffff7c);
          *(undefined1 *)((long)&a_00->bidders[0xc].options + 1) = 1;
        }
LAB_0014b195:
        if ((*(int *)&(a_00->client).closer == 0) || (a_00->bidders[0xb].name == (char *)0x0)) {
          if ((long)(a_00->archive).compression_name < 0x400000) {
            iVar2 = rar_fls((uint)(a_00->archive).compression_name);
            uVar7 = iVar2 << 1;
          }
          else {
            uVar7 = 0x400000;
          }
          pcVar6 = (char *)realloc(a_00->bidders[0xb].name,(ulong)uVar7);
          if (pcVar6 == (char *)0x0) {
            archive_set_error(local_10,0xc,"Unable to allocate memory for uncompressed data.");
            return -0x1e;
          }
          a_00->bidders[0xb].name = pcVar6;
          *(uint *)&(a_00->client).closer = uVar7;
          memset(a_00->bidders[0xb].name,0,(ulong)*(uint *)&(a_00->client).closer);
          *(int *)&a_00->bidders[0xb].bid = *(int *)&(a_00->client).closer + -1;
        }
        *(undefined1 *)&a_00->bidders[0xc].options = 0;
        return 0;
      }
    }
  }
LAB_0014b2a3:
  archive_set_error(local_10,0x54,"Truncated RAR file data");
  *(undefined1 *)&(a_00->client).reader = 0;
  return -0x1e;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unalined_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size, &g_szalloc))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}